

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

ON__UINT16 __thiscall
ON_Outline::Internal_AppendFigure
          (ON_Outline *this,size_t point_count_as_size_t,ON_OutlineFigurePoint *points,
          double short_tolerance,bool bSkipPointFigures)

{
  float fVar1;
  Proximity PVar2;
  bool bVar3;
  Type TVar4;
  bool bVar5;
  Type TVar6;
  ON__UINT16 OVar7;
  uint uVar8;
  uint uVar9;
  ON_OutlineFigure *this_00;
  ON_OutlineFigurePoint *pOVar10;
  ON_OutlineFigurePoint *pOVar11;
  bool local_109;
  double local_100;
  bool local_e5;
  uint local_e0;
  bool local_c9;
  uint local_c0;
  float local_bc;
  uint i_1;
  uint i1;
  bool bPrependQseg;
  ON_2fPoint Qpoint;
  uint i0;
  ON_OutlineFigure *figure;
  ON_OutlineFigurePoint *p;
  ON_OutlineFigurePoint *new_figure_end;
  ON_OutlineFigurePoint *prev_point;
  uint j;
  uint i;
  undefined1 auStack_78 [3];
  bool bDuplicateLoop;
  int dup_check_pass;
  ON_OutlineFigurePoint prev_figure_end;
  ON_OutlineFigurePoint prev_figure_start;
  ON_OutlineFigure *prev_figure;
  undefined1 auStack_50 [7];
  bool bDoubleStrokeReductionTest;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint figure_start;
  uint point_count;
  bool bSkipPointFigures_local;
  double short_tolerance_local;
  ON_OutlineFigurePoint *points_local;
  size_t point_count_as_size_t_local;
  ON_Outline *this_local;
  
  if (point_count_as_size_t == 0) {
    return 0;
  }
  uVar9 = (uint)point_count_as_size_t;
  if ((uVar9 < 2) || (points == (ON_OutlineFigurePoint *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,0x59c,"","Invalid point_count or points[] array.");
    return 0;
  }
  figure_end.m_point = *(ON_2fPoint *)points;
  fVar1 = (points->m_point).y;
  bVar3 = ON_OutlineFigurePoint::IsBeginFigurePoint((ON_OutlineFigurePoint *)&figure_end.m_point);
  if (((!bVar3) ||
      (bVar3 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)&figure_end.m_point),
      !bVar3)) || (bVar3 = ON_2fPoint::IsValid((ON_2fPoint *)&figure_end.m_point.y), !bVar3)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,0x5a7,"","points[0] is not a valid BeginFigure point.");
    return 0;
  }
  pOVar10 = points + (uVar9 - 1);
  auStack_50[0] = pOVar10->m_point_type;
  auStack_50[1] = pOVar10->m_point_proximity;
  auStack_50._2_2_ = pOVar10->m_figure_index;
  unique0x00012004 = (pOVar10->m_point).x;
  figure_end._0_4_ = (pOVar10->m_point).y;
  bVar3 = ON_OutlineFigurePoint::IsEndFigurePoint((ON_OutlineFigurePoint *)auStack_50);
  if (((!bVar3) ||
      (bVar3 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)auStack_50), !bVar3)) ||
     (bVar3 = ON_2fPoint::IsValid((ON_2fPoint *)(auStack_50 + 4)), !bVar3)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,0x5b2,"","points[point_count-1] is not a valid EndFigure point.");
    return 0;
  }
  if (((bSkipPointFigures) && (uVar9 == 2)) &&
     (bVar3 = ON_2fPoint::operator==
                        ((ON_2fPoint *)&figure_end.m_point.y,(ON_2fPoint *)(auStack_50 + 4)), bVar3)
     ) {
    return 0;
  }
  local_c9 = false;
  if ((this->m_figure_type == DoubleStroke) && (local_c9 = false, 2 < uVar9)) {
    TVar4 = ON_OutlineFigurePoint::PointType((ON_OutlineFigurePoint *)&figure_end.m_point);
    local_c9 = false;
    if (TVar4 == BeginFigureClosed) {
      TVar4 = ON_OutlineFigurePoint::PointType((ON_OutlineFigurePoint *)auStack_50);
      local_c9 = false;
      if (TVar4 == EndFigureClosed) {
        local_c9 = ON_2fPoint::operator==
                             ((ON_2fPoint *)&figure_end.m_point.y,(ON_2fPoint *)(auStack_50 + 4));
      }
    }
  }
  bVar3 = false;
  if ((local_c9 != false) && (bVar3 = false, 3 < uVar9)) {
    uVar8 = ON_ClassArray<ON_OutlineFigure>::UnsignedCount(&this->m_figures);
    bVar3 = uVar8 != 0;
  }
  if (bVar3) {
    uVar8 = ON_ClassArray<ON_OutlineFigure>::UnsignedCount(&this->m_figures);
    this_00 = ON_ClassArray<ON_OutlineFigure>::operator[](&this->m_figures,uVar8 - 1);
    if ((this_00->m_figure_type == DoubleStroke) &&
       (uVar8 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this_00->m_points),
       uVar9 == uVar8)) {
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this_00->m_points,0);
      prev_figure_end.m_point = *(ON_2fPoint *)pOVar10;
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this_00->m_points,uVar9 - 1);
      auStack_78[0] = pOVar10->m_point_type;
      auStack_78[1] = pOVar10->m_point_proximity;
      unique0x00012002 = pOVar10->m_figure_index;
      unique0x00012004 = (pOVar10->m_point).x;
      prev_figure_end._0_4_ = (pOVar10->m_point).y;
      TVar4 = ON_OutlineFigurePoint::PointType((ON_OutlineFigurePoint *)&prev_figure_end.m_point);
      if ((TVar4 == BeginFigureClosed) &&
         (((TVar4 = ON_OutlineFigurePoint::PointType((ON_OutlineFigurePoint *)auStack_78),
           TVar4 == EndFigureClosed &&
           (bVar3 = ON_2fPoint::operator==
                              ((ON_2fPoint *)&prev_figure_end.m_point.y,
                               (ON_2fPoint *)&figure_end.m_point.y), bVar3)) &&
          (bVar3 = ON_2fPoint::operator==
                             ((ON_2fPoint *)&dup_check_pass,(ON_2fPoint *)&figure_end.m_point.y),
          bVar3)))) {
        for (i = 0; (int)i < 2; i = i + 1) {
          j._3_1_ = true;
          for (prev_point._4_4_ = 0; prev_point._4_4_ < uVar9;
              prev_point._4_4_ = prev_point._4_4_ + 1) {
            if (i == 0) {
              local_e0 = prev_point._4_4_;
            }
            else {
              local_e0 = (uVar9 - prev_point._4_4_) - 1;
            }
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this_00->m_points,local_e0)
            ;
            bVar3 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
            bVar5 = ON_OutlineFigurePoint::IsOnFigure(points + prev_point._4_4_);
            if (bVar3 == bVar5) {
LAB_0064b68e:
              local_e5 = ON_2fPoint::operator==(&pOVar10->m_point,&points[prev_point._4_4_].m_point)
              ;
            }
            else {
              TVar4 = ON_OutlineFigurePoint::PointType(pOVar10);
              TVar6 = ON_OutlineFigurePoint::PointType(points + prev_point._4_4_);
              local_e5 = false;
              if (TVar4 == TVar6) goto LAB_0064b68e;
            }
            j._3_1_ = local_e5;
            if (local_e5 == false) break;
          }
          if (j._3_1_ != false) {
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this_00->m_points,0);
            pOVar10->m_point_type = BeginFigureOpen;
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                (&this_00->m_points,uVar9 - 2);
            bVar3 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
            if (bVar3) {
              pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                  (&this_00->m_points,uVar9 - 2);
              bVar3 = ON_2fPoint::operator==((ON_2fPoint *)&dup_check_pass,&pOVar10->m_point);
              if (!bVar3) {
                pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::AppendNew(&this_00->m_points);
                uVar9 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this_00->m_points);
                pOVar11 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                    (&this_00->m_points,uVar9 - 2);
                pOVar11->m_point_type = LineTo;
                PVar2 = pOVar11->m_point_proximity;
                OVar7 = pOVar11->m_figure_index;
                fVar1 = (pOVar11->m_point).x;
                pOVar10->m_point_type = pOVar11->m_point_type;
                pOVar10->m_point_proximity = PVar2;
                pOVar10->m_figure_index = OVar7;
                (pOVar10->m_point).x = fVar1;
                (pOVar10->m_point).y = (pOVar11->m_point).y;
                pOVar10->m_point_type = EndFigureOpen;
              }
            }
            this_00->m_figure_type = SingleStroke;
            OVar7 = ON_OutlineFigure::FigureIndex(this_00);
            return OVar7;
          }
        }
      }
    }
  }
  register0x00000000 = ON_ClassArray<ON_OutlineFigure>::AppendNew(&this->m_figures);
  uVar8 = ON_ClassArray<ON_OutlineFigure>::UnsignedCount(&this->m_figures);
  stack0xffffffffffffff58->m_figure_index = (ON__UINT16)uVar8;
  local_100 = short_tolerance;
  if (short_tolerance <= 0.0) {
    local_100 = this->m_short_tolerance;
  }
  stack0xffffffffffffff58->m_short_tolerance = local_100;
  ON_SimpleArray<ON_OutlineFigurePoint>::Append(&stack0xffffffffffffff58->m_points,uVar9,points);
  pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&stack0xffffffffffffff58->m_points,0);
  *(ON_2fPoint *)pOVar10 = figure_end.m_point;
  (pOVar10->m_point).y = fVar1;
  stack0xffffffffffffff58->m_figure_type = this->m_figure_type;
  stack0xffffffffffffff58->m_units_per_em = this->m_units_per_em;
  if (local_c9 == false) goto LAB_0064bf4d;
  Qpoint.x = 0.0;
  _i1 = ON_2fPoint::NanPoint;
  bVar3 = false;
  local_bc = (float)(uVar9 - 1);
  if (local_bc != 2.8026e-45) {
    pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                        (&stack0xffffffffffffff58->m_points,uVar9 - 3);
    bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
    if (!bVar5) {
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,uVar9 - 2);
      bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
      if (bVar5) {
        pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                            (&stack0xffffffffffffff58->m_points,uVar9 - 2);
        bVar5 = ON_2fPoint::operator==(&pOVar10->m_point,(ON_2fPoint *)(auStack_50 + 4));
        if (bVar5) {
          local_bc = (float)(uVar9 - 2);
          goto LAB_0064bad0;
        }
      }
    }
    pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                        (&stack0xffffffffffffff58->m_points,uVar9 - 3);
    bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
    if (bVar5) {
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,uVar9 - 3);
      bVar5 = ON_2fPoint::operator==(&pOVar10->m_point,(ON_2fPoint *)&figure_end.m_point.y);
      if (bVar5) {
        pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                            (&stack0xffffffffffffff58->m_points,uVar9 - 2);
        bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
        if (bVar5) {
          pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,uVar9 - 2);
          TVar4 = ON_OutlineFigurePoint::PointType(pOVar10);
          if (TVar4 == LineTo) {
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                (&stack0xffffffffffffff58->m_points,uVar9 - 2);
            _i1 = pOVar10->m_point;
            bVar3 = ON_2fPoint::operator==((ON_2fPoint *)&i1,(ON_2fPoint *)(auStack_50 + 4));
            bVar3 = !bVar3;
            local_bc = (float)(uVar9 - 3);
          }
        }
      }
    }
  }
LAB_0064bad0:
  if (((uint)Qpoint.x < (uint)local_bc) && (((int)local_bc - (int)Qpoint.x & 1U) == 0)) {
    while ((uint)Qpoint.x < (uint)local_bc) {
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,(uint)Qpoint.x);
      pOVar11 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,(uint)local_bc);
      bVar5 = ON_2fPoint::operator==(&pOVar10->m_point,&pOVar11->m_point);
      if (!bVar5) break;
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,(uint)Qpoint.x);
      bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
      if (!bVar5) break;
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,(uint)local_bc);
      bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
      if (!bVar5) break;
      do {
        Qpoint.x = (float)((int)Qpoint.x + 1);
        local_bc = (float)((int)local_bc - 1);
        local_109 = false;
        if ((uint)Qpoint.x < (uint)local_bc) {
          pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,(uint)Qpoint.x);
          bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
          local_109 = false;
          if (!bVar5) {
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                (&stack0xffffffffffffff58->m_points,(uint)local_bc);
            bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
            local_109 = false;
            if (!bVar5) {
              pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                  (&stack0xffffffffffffff58->m_points,(uint)Qpoint.x);
              TVar4 = ON_OutlineFigurePoint::PointType(pOVar10);
              pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                  (&stack0xffffffffffffff58->m_points,(uint)local_bc);
              TVar6 = ON_OutlineFigurePoint::PointType(pOVar10);
              local_109 = false;
              if (TVar4 == TVar6) {
                pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                    (&stack0xffffffffffffff58->m_points,(uint)Qpoint.x);
                pOVar11 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                    (&stack0xffffffffffffff58->m_points,(uint)local_bc);
                local_109 = ON_2fPoint::operator==(&pOVar10->m_point,&pOVar11->m_point);
              }
            }
          }
        }
      } while (local_109 != false);
    }
    if (Qpoint.x == local_bc) {
      pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                          (&stack0xffffffffffffff58->m_points,(uint)local_bc);
      bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar10);
      if (bVar5) {
        pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                            (&stack0xffffffffffffff58->m_points,(uint)local_bc);
        bVar5 = ON_OutlineFigurePoint::IsEndFigurePoint(pOVar10);
        if ((!bVar5) && ((int)local_bc + 2U <= uVar9)) {
          if (bVar3) {
            if (uVar9 < (int)local_bc + 3U) goto LAB_0064bf4d;
            for (local_c0 = (int)local_bc + 1; local_c0 != 0; local_c0 = local_c0 - 1) {
              pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                  (&stack0xffffffffffffff58->m_points,local_c0 - 1);
              pOVar11 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                  (&stack0xffffffffffffff58->m_points,local_c0);
              PVar2 = pOVar10->m_point_proximity;
              OVar7 = pOVar10->m_figure_index;
              fVar1 = (pOVar10->m_point).x;
              pOVar11->m_point_type = pOVar10->m_point_type;
              pOVar11->m_point_proximity = PVar2;
              pOVar11->m_figure_index = OVar7;
              (pOVar11->m_point).x = fVar1;
              (pOVar11->m_point).y = (pOVar10->m_point).y;
            }
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                (&stack0xffffffffffffff58->m_points,0);
            pOVar10->m_point = _i1;
            pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                                (&stack0xffffffffffffff58->m_points,1);
            pOVar10->m_point_type = LineTo;
            local_bc = (float)((int)local_bc + 1);
          }
          pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,0);
          pOVar10->m_point_type = BeginFigureOpen;
          pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,(uint)local_bc);
          pOVar11 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,(int)local_bc + 1);
          pOVar11->m_point = pOVar10->m_point;
          pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,(int)local_bc + 1);
          pOVar10->m_point_type = EndFigureOpen;
          pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                              (&stack0xffffffffffffff58->m_points,(int)local_bc + 1);
          pOVar10->m_point_proximity = OnFigure;
          stack0xffffffffffffff58->m_figure_type = SingleStroke;
          ON_SimpleArray<ON_OutlineFigurePoint>::SetCount
                    (&stack0xffffffffffffff58->m_points,(int)local_bc + 2);
        }
      }
    }
  }
LAB_0064bf4d:
  this->m_sorted_figure_outer_orientation = Unset;
  return stack0xffffffffffffff58->m_figure_index;
}

Assistant:

ON__UINT16 ON_Outline::Internal_AppendFigure(
  size_t point_count_as_size_t,
  const ON_OutlineFigurePoint* points,
  double short_tolerance,
  bool bSkipPointFigures
)
{
  if (0 == point_count_as_size_t)
    return 0;
  
  const unsigned int point_count = (unsigned int)point_count_as_size_t;

  if (point_count < 2 || nullptr == points)
  {
    ON_ERROR("Invalid point_count or points[] array.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_start = points[0];
  if (
    false == figure_start.IsBeginFigurePoint()
    || false == figure_start.IsOnFigure()
    || false == figure_start.m_point.IsValid()
    )
  {
    ON_ERROR("points[0] is not a valid BeginFigure point.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_end = points[point_count-1];
  if (
    false == figure_end.IsEndFigurePoint()
    || false == figure_end.IsOnFigure()
    || false == figure_end.m_point.IsValid()
    )
  {
    ON_ERROR("points[point_count-1] is not a valid EndFigure point.");
    return 0;
  }

  if (bSkipPointFigures && 2 == point_count && figure_start.m_point == figure_end.m_point)
    return 0;

  const bool bDoubleStrokeReductionTest
    = ON_OutlineFigure::Type::DoubleStroke == m_figure_type
    && point_count >= 3
    && ON_OutlineFigurePoint::Type::BeginFigureClosed == figure_start.PointType()
    && ON_OutlineFigurePoint::Type::EndFigureClosed == figure_end.PointType()
    && figure_start.m_point == figure_end.m_point;

  while (
    bDoubleStrokeReductionTest
    && point_count >= 4
    && m_figures.UnsignedCount() > 0
    )
  {
    ON_OutlineFigure& prev_figure = m_figures[m_figures.UnsignedCount() - 1];
    if (ON_OutlineFigure::Type::DoubleStroke != prev_figure.m_figure_type)
      break;
    if (point_count != (prev_figure.m_points.UnsignedCount()))
      break;
    const ON_OutlineFigurePoint prev_figure_start = prev_figure.m_points[0];
    const ON_OutlineFigurePoint prev_figure_end = prev_figure.m_points[point_count-1];
    if (ON_OutlineFigurePoint::Type::BeginFigureClosed != prev_figure_start.PointType())
      break;
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != prev_figure_end.PointType())
      break;
    if (false == (prev_figure_start.m_point == figure_start.m_point) )
      break;
    if (false == (prev_figure_end.m_point == figure_start.m_point) )
      break;

    for (int dup_check_pass = 0; dup_check_pass < 2; dup_check_pass++)
    {
      bool bDuplicateLoop = true;
      for (unsigned int i = 0; i < point_count; i++)
      {
        const unsigned int j = (0 == dup_check_pass) ? i : (point_count - i - 1);
        const ON_OutlineFigurePoint& prev_point = prev_figure.m_points[j];
        bDuplicateLoop
          = (prev_point.IsOnFigure() == points[i].IsOnFigure() || prev_point.PointType() == points[i].PointType())
          && prev_point.m_point == points[i].m_point;
        if (false == bDuplicateLoop)
          break;
      }
      if (false == bDuplicateLoop)
        continue;

      // This figure is the double stroke duplicate of the previous figure (double stroke glphys like O).
      prev_figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
      if (
        prev_figure.m_points[point_count - 2].IsOnFigure()
        && false == (prev_figure_end.m_point == prev_figure.m_points[point_count - 2].m_point)
        )
      {
        ON_OutlineFigurePoint& new_figure_end = prev_figure.m_points.AppendNew();
        ON_OutlineFigurePoint& p = prev_figure.m_points[prev_figure.m_points.UnsignedCount() - 2];
        p.m_point_type = ON_OutlineFigurePoint::Type::LineTo;
        new_figure_end = p;
        new_figure_end.m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
      }
      prev_figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
      return prev_figure.FigureIndex();
    }
    break;
  }
  
  ON_OutlineFigure& figure = m_figures.AppendNew();
  figure.m_figure_index = (ON__UINT16)m_figures.UnsignedCount();
  figure.m_short_tolerance = (short_tolerance>0.0) ? short_tolerance : m_short_tolerance;
  figure.m_points.Append((int)point_count, points);
  figure.m_points[0] = figure_start;
  figure.m_figure_type = m_figure_type;
  figure.m_units_per_em = this->m_units_per_em;

  while (bDoubleStrokeReductionTest)
  {
    // check for a double stroke figure like those in CamBam Stick fonts
    unsigned int i0 = 0;

    ON_2fPoint Qpoint(ON_2fPoint::NanPoint);
    bool bPrependQseg = false;
    unsigned int i1 = (unsigned int)(point_count - 1);
    if (i1 - 2 > 0)
    {
      if (
        false == figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 1].IsOnFigure()
        && figure.m_points[i1 - 1].m_point == figure_end.m_point
        )
      {
        i1--;
      }
      else if (
        figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 2].m_point == figure_start.m_point
        && figure.m_points[i1 - 1].IsOnFigure()
        && ON_OutlineFigurePoint::Type::LineTo == figure.m_points[i1 - 1].PointType()
        )
      {
        Qpoint = figure.m_points[i1 - 1].m_point;
        if (false == (Qpoint == figure_end.m_point))
          bPrependQseg = true;
        i1 -= 2;
      }
    }
   
    if (i0 >= i1)
      break;

    if (0 != (i1 - i0) % 2)
      break;

    while (i0 < i1)
    {
      if (false == (figure.m_points[i0].m_point == figure.m_points[i1].m_point))
        break;
      if (false == figure.m_points[i0].IsOnFigure() || false == figure.m_points[i1].IsOnFigure())
        break;
      i0++;
      i1--;
      while (
        i0 < i1
        && false == figure.m_points[i0].IsOnFigure()
        && false == figure.m_points[i1].IsOnFigure()
        && figure.m_points[i0].PointType() == figure.m_points[i1].PointType()
        && figure.m_points[i0].m_point == figure.m_points[i1].m_point
        )
      {
        i0++;
        i1--;
      }
    }
    if (i0 != i1)
      break;
    if (false == figure.m_points[i1].IsOnFigure())
      break;
    if (figure.m_points[i1].IsEndFigurePoint())
      break;
    if ((size_t)(i1 + 2) > point_count)
      break;

    if ( bPrependQseg )
    {
      if ((i1 + 3) > point_count)
        break;
      for (unsigned int i = i1 + 1; i > 0; i--)
        figure.m_points[i] = figure.m_points[i - 1];
      figure.m_points[0].m_point = Qpoint;
      figure.m_points[1].m_point_type = ON_OutlineFigurePoint::Type::LineTo;
      i1++;
    }
    figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
    figure.m_points[i1 + 1].m_point = figure.m_points[i1].m_point;
    figure.m_points[i1 + 1].m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
    figure.m_points[i1 + 1].m_point_proximity = ON_OutlineFigurePoint::Proximity::OnFigure;
    figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
    figure.m_points.SetCount(i1 + 2);

    break;
  }

  m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Unset;
  return figure.m_figure_index;
}